

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

uint32_t * parasail_reverse_uint32_t(uint32_t *s,size_t length)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  bool bVar3;
  
  puVar1 = (uint32_t *)malloc(length * 4);
  puVar2 = puVar1;
  if (puVar1 == (uint32_t *)0x0) {
    fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_reverse_uint32_t",length * 4);
  }
  else {
    while (bVar3 = length != 0, length = length - 1, bVar3) {
      *puVar2 = s[length];
      puVar2 = puVar2 + 1;
    }
  }
  return puVar1;
}

Assistant:

uint32_t* parasail_reverse_uint32_t(const uint32_t *s, size_t length)
{
    uint32_t *r = NULL;
    size_t i = 0;
    size_t j = 0;

    PARASAIL_CALLOC(r, uint32_t, length);
    for (i=0,j=length-1; i<length; ++i,--j) {
        r[i] = s[j];
    }

    return r;
}